

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  uchar chan;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  BasePort *Port;
  char *pcVar5;
  int iVar6;
  int curLine;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 auStack_1318 [8];
  BasePort *local_1310;
  uint local_1308;
  uint local_1304;
  uint local_1300;
  allocator<char> local_12f9;
  Amp1394Console console;
  string QLA_SN;
  string stringLine;
  string logFilename;
  string portDescription;
  string FPGA_SN;
  ofstream logFile;
  int aiStack_11f0 [120];
  stringstream debugStream;
  ostream local_1000 [8];
  string local_ff8 [8];
  byte abStack_ff0 [360];
  AmpIO Board;
  
  BasePort::DefaultPort_abi_cxx11_();
  uVar9 = 0;
  uVar3 = 0;
  if (1 < argc) {
    iVar7 = 0;
    uVar9 = 0;
    uVar3 = 0;
    for (uVar8 = 1; (uint)argc != uVar8; uVar8 = uVar8 + 1) {
      pcVar5 = argv[uVar8];
      if (*pcVar5 == '-') {
        if (pcVar5[1] == 'q') {
          uVar9 = (int)pcVar5[2] - 0x30;
        }
        else {
          if (pcVar5[1] != 'p') {
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     "Usage: qlatest [<board-num>] [-pP] [-qN]");
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<(poVar4,
                                     "       where <board-num> = rotary switch setting (0-15, default 0)"
                                    );
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<(poVar4,"             P = port number (default 0)");
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<(poVar4,
                                     "                 can also specify -pfwP, -pethP or -pudp");
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<(poVar4,"             N = QLA number (1 or 2) on DQLA");
            iVar7 = 0;
            std::endl<char,std::char_traits<char>>(poVar4);
            goto LAB_00109363;
          }
          std::__cxx11::string::assign((char *)&portDescription);
        }
      }
      else {
        if (iVar7 == 0) {
          uVar3 = atoi(pcVar5);
          poVar4 = std::operator<<((ostream *)&std::cerr,"Selecting board ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        iVar7 = iVar7 + 1;
      }
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&debugStream,_S_out|_S_in);
  local_1310 = PortFactory(portDescription._M_dataplus._M_p,local_1000);
  if (local_1310 == (BasePort *)0x0) {
    PrintDebugStream(&debugStream);
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to create port using: ");
    poVar4 = std::operator<<(poVar4,(string *)&portDescription);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    iVar7 = (*local_1310->_vptr_BasePort[0x11])();
    if ((char)iVar7 != '\0') {
      local_1308 = 0;
      if ((((byte)uVar3 < 0x10) && (local_1310->HardwareVersion[uVar3 & 0xf] == 0x44514c41)) &&
         (local_1308 = uVar9, 1 < uVar9 - 1)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,
                                 "Must specify -q1 or -q2 to select QLA number for DQLA");
        std::endl<char,std::char_traits<char>>(poVar4);
        (*local_1310->_vptr_BasePort[0xb])();
        iVar7 = 0;
        goto LAB_00109356;
      }
      local_1300 = uVar3 & 0xff;
      AmpIO::AmpIO(&Board,(byte)uVar3);
      (*local_1310->_vptr_BasePort[0xd])(local_1310,&Board);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&logFilename,"QLA_",(allocator<char> *)&logFile);
      chan = (uchar)local_1308;
      AmpIO::GetQLASerialNumber_abi_cxx11_(&QLA_SN,&Board,(uchar)local_1308);
      if (QLA_SN._M_string_length == 0) {
        std::operator<<((ostream *)&std::cerr,"QLA serial number not found. Program now (y/n)? ");
        uVar9 = getchar();
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        if ((uVar9 & 0xdf) == 0x59) {
          bVar2 = PromQLASerialNumberProgram(&Board,chan);
          if (bVar2) {
            AmpIO::GetQLASerialNumber_abi_cxx11_((string *)&logFile,&Board,chan);
            std::__cxx11::string::operator=((string *)&QLA_SN,(string *)&logFile);
            std::__cxx11::string::~string((string *)&logFile);
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to program QLA serial number");
            std::endl<char,std::char_traits<char>>(poVar4);
          }
        }
        if (QLA_SN._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&QLA_SN);
        }
      }
      std::__cxx11::string::append((string *)&logFilename);
      std::__cxx11::string::append((char *)&logFilename);
      std::ofstream::ofstream(&logFile,logFilename._M_dataplus._M_p,_S_out);
      if (*(int *)((long)aiStack_11f0 + *(long *)(_logFile + -0x18)) == 0) {
        poVar4 = std::operator<<((ostream *)&logFile,"====== TEST REPORT ======");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<((ostream *)&logFile,"QLA S/N: ");
        std::operator<<(poVar4,(string *)&QLA_SN);
        if (local_1308 != 0) {
          poVar4 = std::operator<<((ostream *)&logFile," (QLA ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::operator<<(poVar4," of DQLA)");
        }
        std::endl<char,std::char_traits<char>>((ostream *)&logFile);
        uVar9 = BoardIO::GetFpgaVersionMajor((BoardIO *)&Board);
        if (uVar9 == 3) {
          poVar4 = std::operator<<((ostream *)&logFile,"FPGA V3");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        else {
          FpgaIO::GetFPGASerialNumber_abi_cxx11_(&FPGA_SN,&Board.super_FpgaIO);
          if (CONCAT44(FPGA_SN._M_string_length._4_4_,(undefined4)FPGA_SN._M_string_length) == 0) {
            std::__cxx11::string::assign((char *)&FPGA_SN);
          }
          poVar4 = std::operator<<((ostream *)&logFile,"FPGA S/N: ");
          poVar4 = std::operator<<(poVar4,(string *)&FPGA_SN);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)&FPGA_SN);
        }
        poVar4 = std::operator<<((ostream *)&logFile,"FPGA Firmware Version: ");
        BoardIO::GetFirmwareVersion((BoardIO *)&Board);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        console.isOk = false;
        console.noEcho = false;
        console.noBlock = false;
        console.Internals = (ConsoleInternals *)0x0;
        Amp1394Console::Init(&console);
        if (console.isOk == false) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to initialize console");
          std::endl<char,std::char_traits<char>>(poVar4);
          (*local_1310->_vptr_BasePort[0xe])(local_1310,(ulong)local_1300);
          iVar7 = -1;
        }
        else {
          Amp1394Console::Print
                    (1,9,"QLA Test for Board %d, S/N %s",(ulong)uVar3,QLA_SN._M_dataplus._M_p);
          Amp1394Console::Print(3,9,"0) Quit");
          Amp1394Console::Print(4,9,"1) Test digital input:");
          Amp1394Console::Print(5,9,"2) Test encoder feedback:");
          Amp1394Console::Print(6,9,"3) Test analog feedback:");
          Amp1394Console::Print(7,9,"4) Test motor power control:");
          Amp1394Console::Print(8,9,"5) Test power amplifier:");
          iVar7 = (*local_1310->_vptr_BasePort[0xf])();
          if (iVar7 == 0) {
            if (1 < uVar9) goto LAB_00108f5c;
          }
          else {
            iVar7 = (*local_1310->_vptr_BasePort[0xf])();
            if ((1 < uVar9) && (iVar7 == 3)) {
LAB_00108f5c:
              Amp1394Console::Print(9,9,"6) Test Ethernet controller:");
            }
          }
          Amp1394Console::Refresh();
          iVar7 = 0x14;
          bVar2 = false;
          local_1304 = uVar9;
          while (!bVar2) {
            std::__cxx11::stringbuf::str();
            lVar1 = CONCAT44(FPGA_SN._M_string_length._4_4_,(undefined4)FPGA_SN._M_string_length);
            std::__cxx11::string::~string((string *)&FPGA_SN);
            if (lVar1 != 0) {
              FPGA_SN.field_2._M_allocated_capacity._0_4_ = 0x20202020;
              FPGA_SN.field_2._M_allocated_capacity._4_4_ = 0x20202020;
              FPGA_SN.field_2._8_4_ = 0x20202020;
              FPGA_SN.field_2._12_4_ = 0x20202020;
              FPGA_SN._M_dataplus._M_p._0_4_ = 0x20202020;
              FPGA_SN._M_dataplus._M_p._4_4_ = 0x20202020;
              FPGA_SN._M_string_length._0_4_ = 0x20202020;
              FPGA_SN._M_string_length._4_4_ = 0x20202020;
              for (iVar6 = 0x14; iVar6 < iVar7; iVar6 = iVar6 + 1) {
                Amp1394Console::Print(iVar6,9,(char *)&FPGA_SN);
              }
              iVar7 = 0x14;
              while ((abStack_ff0[*(long *)(_debugStream + -0x18)] & 2) == 0) {
                stringLine._M_dataplus._M_p = (pointer)&stringLine.field_2;
                stringLine._M_string_length = 0;
                stringLine.field_2._M_local_buf[0] = '\0';
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&debugStream,(string *)&stringLine);
                Amp1394Console::Print(iVar7,9,stringLine._M_dataplus._M_p);
                iVar7 = iVar7 + 1;
                std::__cxx11::string::~string((string *)&stringLine);
              }
              std::ios::clear((int)auStack_1318 + (int)*(long *)(_debugStream + -0x18) + 0x308);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&stringLine,"",&local_12f9);
              std::__cxx11::stringbuf::str(local_ff8);
              std::__cxx11::string::~string((string *)&stringLine);
            }
            Amp1394Console::Print(10,10,"Select option: ");
            iVar6 = Amp1394Console::GetChar(&console);
            switch(iVar6) {
            case 0x30:
              bVar2 = true;
              goto LAB_00109253;
            case 0x31:
              ClearLines(0xc,0x14);
              bVar2 = TestDigitalInputs(0xc,&Board,local_1310,&logFile,local_1308);
              pcVar5 = "FAIL";
              if (bVar2) {
                pcVar5 = "PASS";
              }
              iVar6 = 4;
              break;
            case 0x32:
              ClearLines(0xc,0x14);
              bVar2 = TestEncoders(0xc,&Board,local_1310,&logFile,local_1308);
              pcVar5 = "FAIL";
              if (bVar2) {
                pcVar5 = "PASS";
              }
              iVar6 = 5;
              break;
            case 0x33:
              ClearLines(0xc,0x14);
              bVar2 = TestAnalogInputs(0xc,&Board,local_1310,&logFile,local_1308);
              pcVar5 = "FAIL";
              if (bVar2) {
                pcVar5 = "PASS";
              }
              iVar6 = 6;
              break;
            case 0x34:
              ClearLines(0xc,0x14);
              bVar2 = TestMotorPowerControl(0xc,&Board,local_1310,&logFile,local_1308);
              pcVar5 = "FAIL";
              if (bVar2) {
                pcVar5 = "PASS";
              }
              iVar6 = 7;
              break;
            case 0x35:
              ClearLines(0xc,0x14);
              bVar2 = TestPowerAmplifier(0xc,&Board,local_1310,&logFile,local_1308);
              pcVar5 = "FAIL";
              if (bVar2) {
                pcVar5 = "PASS";
              }
              iVar6 = 8;
              break;
            case 0x36:
              iVar6 = (*local_1310->_vptr_BasePort[0xf])();
              if (iVar6 == 0) {
                if (local_1304 < 2) goto switchD_001090dd_default;
              }
              else {
                iVar6 = (*local_1310->_vptr_BasePort[0xf])();
                bVar2 = false;
                if ((local_1304 < 2) || (iVar6 != 3)) goto LAB_00109253;
              }
              curLine = 0xc;
              ClearLines(0xc,0x14);
              iVar6 = 9;
              if (local_1304 == 2) {
                bVar2 = TestEthernetV2(curLine,&Board,Port,&logFile);
LAB_001092d7:
                pcVar5 = "PASS";
                if (bVar2 != false) break;
              }
              else if (local_1304 == 3) {
                bVar2 = TestEthernetV3(curLine,&Board,Port,&logFile);
                goto LAB_001092d7;
              }
              pcVar5 = "FAIL";
              break;
            default:
switchD_001090dd_default:
              bVar2 = false;
              goto LAB_00109253;
            }
            bVar2 = false;
            Amp1394Console::Print(iVar6,0x2e,pcVar5);
LAB_00109253:
            Amp1394Console::Refresh();
          }
          (*local_1310->_vptr_BasePort[0xe])(local_1310,(ulong)local_1300);
          iVar7 = 0;
          Amp1394Console::End(&console);
        }
        (*local_1310->_vptr_BasePort[0xb])();
        Amp1394Console::~Amp1394Console(&console);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to open log file ");
        poVar4 = std::operator<<(poVar4,(string *)&logFilename);
        std::endl<char,std::char_traits<char>>(poVar4);
        (*local_1310->_vptr_BasePort[0xe])(local_1310,(ulong)local_1300);
        (*local_1310->_vptr_BasePort[0xb])();
        iVar7 = 0;
      }
      std::ofstream::~ofstream(&logFile);
      std::__cxx11::string::~string((string *)&QLA_SN);
      std::__cxx11::string::~string((string *)&logFilename);
      AmpIO::~AmpIO(&Board);
      goto LAB_00109356;
    }
    PrintDebugStream(&debugStream);
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to initialize ");
    BasePort::GetPortTypeString_abi_cxx11_((string *)&Board,local_1310);
    poVar4 = std::operator<<(poVar4,(string *)&Board);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&Board);
  }
  iVar7 = -1;
LAB_00109356:
  std::__cxx11::stringstream::~stringstream((stringstream *)&debugStream);
LAB_00109363:
  std::__cxx11::string::~string((string *)&portDescription);
  return iVar7;
}

Assistant:

int main(int argc, char** argv)
{
    int i;
    int board = 0;
    unsigned int qlaNum = 0;    // QLA number (1 or 2 for DQLA)

    std::string portDescription = BasePort::DefaultPort();

    if (argc > 1) {
        int args_found = 0;
        for (i = 1; i < argc; i++) {
            if (argv[i][0] == '-') {
                if (argv[i][1] == 'p') {
                    portDescription = argv[i]+2;
                }
                else if (argv[i][1] == 'q') {
                    qlaNum = argv[i][2]-'0';
                }
                else {
                    std::cerr << "Usage: qlatest [<board-num>] [-pP] [-qN]" << std::endl
                    << "       where <board-num> = rotary switch setting (0-15, default 0)" << std::endl
                    << "             P = port number (default 0)" << std::endl
                    << "                 can also specify -pfwP, -pethP or -pudp" << std::endl
                    << "             N = QLA number (1 or 2) on DQLA" << std::endl;
                    return 0;
                }
            }
            else {
                if (args_found == 0) {
                    board = atoi(argv[i]);
                    std::cerr << "Selecting board " << board << std::endl;
                }
                args_found++;
            }
        }
    }

    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    BasePort *Port = PortFactory(portDescription.c_str(), debugStream);
    if (!Port) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to create port using: " << portDescription << std::endl;
        return -1;
    }
    if (!Port->IsOK()) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to initialize " << Port->GetPortTypeString() << std::endl;
        return -1;
    }

    bool isDQLA = (Port->GetHardwareVersion(board) == DQLA_String);
    if (isDQLA) {
        if (!((qlaNum == 1) || (qlaNum == 2))) {
            std::cerr << "Must specify -q1 or -q2 to select QLA number for DQLA" << std::endl;
            delete Port;
            return 0;
        }
    }
    else if (qlaNum != 0) {
        // If not DQLA, force qlaNum to 0
        qlaNum = 0;
    }

    AmpIO Board(board);
    Port->AddBoard(&Board);

    std::string logFilename("QLA_");
    std::string QLA_SN = Board.GetQLASerialNumber(qlaNum);
    if (QLA_SN.empty()) {
        std::cerr << "QLA serial number not found. Program now (y/n)? ";
#ifdef _MSC_VER
        char resp = _getch();
#else
        char resp = getchar();
#endif
        std::cerr << std::endl;
        if ((resp == 'y') || (resp == 'Y')) {
            if (PromQLASerialNumberProgram(Board, qlaNum))
                QLA_SN = Board.GetQLASerialNumber(qlaNum);
            else
                std::cerr << "Failed to program QLA serial number" << std::endl;
        }
        if (QLA_SN.empty()) {
            QLA_SN.assign("Unknown");
        }
    }
    logFilename.append(QLA_SN);
    logFilename.append(".log");
    std::ofstream logFile(logFilename.c_str());
    if (!logFile.good()) {
        std::cerr << "Failed to open log file " << logFilename << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return 0;
    }
    logFile << "====== TEST REPORT ======" << std::endl << std::endl;
    logFile << "QLA S/N: " << QLA_SN;
    if (qlaNum != 0)
        logFile << " (QLA " << qlaNum << " of DQLA)";
    logFile << std::endl;

    unsigned int fpgaVer = Board.GetFpgaVersionMajor();
    if (fpgaVer == 3) {
        logFile << "FPGA V3" << std::endl;
    }
    else {
        std::string FPGA_SN = Board.GetFPGASerialNumber();
        if (FPGA_SN.empty())
            FPGA_SN.assign("Unknown");
        logFile << "FPGA S/N: " << FPGA_SN << std::endl;
    }

    logFile << "FPGA Firmware Version: " << Board.GetFirmwareVersion() << std::endl;

    Amp1394Console console(Amp1394Console::FLAG_ECHO|Amp1394Console::FLAG_BLOCKING);
    console.Init();
    if (!console.IsOK()) {
        std::cerr << "Failed to initialize console" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }

    console.Print(1, 9, "QLA Test for Board %d, S/N %s", board, QLA_SN.c_str());

    console.Print(3, 9, "0) Quit");
    console.Print(4, 9, "1) Test digital input:");
    console.Print(5, 9, "2) Test encoder feedback:");
    console.Print(6, 9, "3) Test analog feedback:");
    console.Print(7, 9, "4) Test motor power control:");
    console.Print(8, 9, "5) Test power amplifier:");   // includes current feedback & temp sense
    if (((Port->GetPortType() == BasePort::PORT_FIREWIRE) ||
         (Port->GetPortType() == BasePort::PORT_ZYNQ_EMIO)) && (fpgaVer > 1))
        console.Print(9, 9, "6) Test Ethernet controller:");

    console.Refresh();

    const int TEST_START_LINE = 12;
    const int DEBUG_START_LINE = 20;
    int last_debug_line = DEBUG_START_LINE;

    bool done = false;
    while (!done) {

        if (!debugStream.str().empty()) {
            int cur_line = DEBUG_START_LINE;
            char line[80];
            memset(line, ' ', sizeof(line));
            for (i = cur_line; i < last_debug_line; i++)
                console.Print(i, 9, line);
            while (!debugStream.eof()) {
                std::string stringLine;
                std::getline(debugStream, stringLine);
                console.Print(cur_line++, 9, stringLine.c_str());
            }
            debugStream.clear();
            debugStream.str("");
            last_debug_line = cur_line;
        }

        console.Print(10, 10, "Select option: ");
        int c = console.GetChar();

        switch (c) {
            case '0':   // Quit
                done = true;
                break;
            case '1':   // Test digital input
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestDigitalInputs(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(4, 46, "PASS");
                else
                    console.Print(4, 46, "FAIL");
                break;

            case '2':    // Test encoder feedback
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestEncoders(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(5, 46, "PASS");
                else
                    console.Print(5, 46, "FAIL");
                break;

            case '3':    // Test analog feedback
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestAnalogInputs(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(6, 46, "PASS");
                else
                    console.Print(6, 46, "FAIL");
                break;

            case '4':
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestMotorPowerControl(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(7, 46, "PASS");
                else
                    console.Print(7, 46, "FAIL");
                break;

            case '5':
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestPowerAmplifier(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(8, 46, "PASS");
                else
                    console.Print(8, 46, "FAIL");
                break;

            case '6':
                 if (((Port->GetPortType() == BasePort::PORT_FIREWIRE) ||
                      (Port->GetPortType() == BasePort::PORT_ZYNQ_EMIO)) && (fpgaVer > 1)) {
                    ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                    if ((fpgaVer == 2) && TestEthernetV2(TEST_START_LINE, Board, Port, logFile))
                        console.Print(9, 46, "PASS");
                    else if ((fpgaVer == 3) && TestEthernetV3(TEST_START_LINE, Board, Port, logFile))
                        console.Print(9, 46, "PASS");
                    else
                        console.Print(9, 46, "FAIL");
                }
                break;

        }

        console.Refresh();
    }

    Port->RemoveBoard(board);
    console.End();
    delete Port;
}